

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_swap_Nbytes(size_t n,int siz,void *ar)

{
  switch(siz - 2U >> 1 | (uint)((siz - 2U & 1) != 0) << 0x1f) {
  case 0:
    nifti_swap_2bytes(n,ar);
    return;
  case 1:
    nifti_swap_4bytes(n,ar);
    return;
  default:
    fprintf(_stderr,"** NIfTI: cannot swap in %d byte blocks\n",siz);
    return;
  case 3:
    nifti_swap_8bytes(n,ar);
    return;
  case 7:
    nifti_swap_16bytes(n,ar);
    return;
  }
}

Assistant:

void nifti_swap_Nbytes( size_t n , int siz , void *ar )  /* subsuming case */
{
   switch( siz ){
     case 2:  nifti_swap_2bytes ( n , ar ) ; break ;
     case 4:  nifti_swap_4bytes ( n , ar ) ; break ;
     case 8:  nifti_swap_8bytes ( n , ar ) ; break ;
     case 16: nifti_swap_16bytes( n , ar ) ; break ;
     default:    /* nifti_swap_bytes  ( n , siz, ar ) ; */
        fprintf(stderr,"** NIfTI: cannot swap in %d byte blocks\n", siz);
        break ;
   }
   return ;
}